

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O1

bool __thiscall tl::CStrT<char>::operator==(CStrT<char> *this,CStrT<char> o)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  bool bVar6;
  
  uVar3 = this->_size;
  if (uVar3 != o._size) {
    return false;
  }
  bVar6 = uVar3 == 0;
  if ((!bVar6) && (*this->_str == *o._str)) {
    lVar5 = 1;
    do {
      uVar4 = (uint)lVar5;
      if (uVar3 == uVar4) break;
      pcVar1 = this->_str + lVar5;
      pcVar2 = o._str + lVar5;
      lVar5 = lVar5 + 1;
    } while (*pcVar1 == *pcVar2);
    bVar6 = uVar3 <= uVar4;
  }
  return bVar6;
}

Assistant:

bool CStrT<CharT>::operator==(CStrT o)const
{
    if(_size != o._size)
        return false;
    for(u32 i=0; i<_size; i++) {
        if(_str[i] != o._str[i])
            return false;
    }
    return true;
}